

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::FinalizeAllocation
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
           *this,TEmitBufferAllocation *allocation,BYTE *dstBuffer)

{
  bool bVar1;
  bool bVar2;
  DWORD alignPad;
  ulong uVar3;
  BYTE *local_40;
  BYTE *buffer;
  
  uVar3 = allocation->bytesCommitted - allocation->bytesUsed;
  bVar2 = true;
  alignPad = (DWORD)uVar3;
  if (alignPad != 0) {
    local_40 = (BYTE *)0x0;
    buffer = (BYTE *)(uVar3 & 0xffffffff);
    GetBuffer(this,allocation,(size_t)buffer,&local_40);
    bVar1 = CommitBuffer(this,allocation,allocation->bytesCommitted,dstBuffer,0,(BYTE *)0x0,alignPad
                        );
    if (bVar1) {
      this->totalBytesCode = this->totalBytesCode - (long)buffer;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FinalizeAllocation(TEmitBufferAllocation *allocation, BYTE * dstBuffer)
{
    Assert(this->criticalSection.IsLocked());

    DWORD bytes = allocation->BytesFree();
    if(bytes > 0)
    {
        BYTE* buffer = nullptr;
        this->GetBuffer(allocation, bytes, &buffer);
        if (!this->CommitBuffer(allocation, allocation->bytesCommitted, dstBuffer, 0, /*sourceBuffer=*/ nullptr, /*alignPad=*/ bytes))
        {
            return false;
        }

#if DBG_DUMP
        this->totalBytesCode -= bytes;
#endif
    }

    return true;
}